

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O1

void __thiscall
booster::callback<void(std::error_code_const&,unsigned_long)>::
callback<void(*)(std::error_code_const&,unsigned_long)>
          (callback<void(std::error_code_const&,unsigned_long)> *this,
          _func_void_error_code_ptr_unsigned_long *func)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)operator_new(0x18);
  *puVar1 = &PTR__refcounted_00116b50;
  booster::atomic_counter::atomic_counter((atomic_counter *)(puVar1 + 1),0);
  *puVar1 = &PTR__refcounted_00116cc8;
  puVar1[2] = func;
  *(undefined8 **)this = puVar1;
  booster::atomic_counter::inc();
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}